

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

bool __thiscall llvm::APInt::operator==(APInt *this,uint64_t Val)

{
  uint uVar1;
  uint64_t uVar2;
  
  if ((0x40 < this->BitWidth) && (uVar1 = getActiveBits(this), 0x40 < uVar1)) {
    return false;
  }
  uVar2 = getZExtValue(this);
  return uVar2 == Val;
}

Assistant:

bool operator==(uint64_t Val) const {
    return (isSingleWord() || getActiveBits() <= 64) && getZExtValue() == Val;
  }